

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O1

Matrix<double,__1,__1> __thiscall
Matrix<double,_-1,_-1>::inverse(Matrix<double,__1,__1> *this,int *flag)

{
  double dVar1;
  Matrix<double,__1,__1> MVar2;
  double *pdVar3;
  long *plVar4;
  int j;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Matrix<double,__1,__1> copy;
  Matrix<double,__1,__1> Identity_;
  Matrix<double,__1,__1> local_90;
  double local_80;
  double local_78;
  undefined8 uStack_70;
  int *local_60;
  double local_58;
  undefined8 uStack_50;
  Matrix<double,__1,__1> local_40;
  
  local_40.data = (double *)0x0;
  local_40.rows = -1;
  local_40.cols = -1;
  local_90.data = (double *)0x0;
  local_90.rows = -1;
  local_90.cols = -1;
  operator=(&local_90,*this);
  resize(&local_40,local_90.rows,local_90.cols);
  Identity(&local_40);
  if (this->cols == this->rows) {
    local_60 = flag;
    iVar7 = 0;
    do {
      if (local_90.rows + -1 <= iVar7) {
        iVar7 = local_90.rows;
        goto LAB_0010fe9c;
      }
      pdVar3 = operator()(&local_90,iVar7,iVar7);
      local_58 = ABS(*pdVar3);
      iVar8 = iVar7 + 1;
      iVar6 = iVar7;
      iVar5 = iVar8;
      if (iVar8 < local_90.rows) {
        do {
          uStack_50 = 0;
          pdVar3 = operator()(&local_90,iVar5,iVar7);
          if (local_58 < ABS(*pdVar3)) {
            local_58 = ABS(*pdVar3);
            iVar6 = iVar5;
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 < local_90.rows);
      }
      local_58 = ABS(local_58);
      uStack_50 = 0;
      if (local_58 <= 1e-10) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"this matrix is not invertible",0x1d);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
        std::ostream::put(-0x10);
        plVar4 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
        std::ostream::put((char)plVar4);
        std::ostream::flush();
        *local_60 = 1;
        if (local_90.data != (double *)0x0) {
          operator_delete__(local_90.data);
        }
      }
      else {
        if ((iVar6 != iVar7) && (0 < local_90.cols)) {
          iVar5 = 0;
          do {
            pdVar3 = operator()(&local_90,iVar7,iVar5);
            local_78 = *pdVar3;
            pdVar3 = operator()(&local_90,iVar6,iVar5);
            SetElement(&local_90,iVar7,iVar5,*pdVar3);
            SetElement(&local_90,iVar6,iVar5,local_78);
            pdVar3 = operator()(&local_40,iVar7,iVar5);
            local_78 = *pdVar3;
            pdVar3 = operator()(&local_40,iVar6,iVar5);
            SetElement(&local_40,iVar7,iVar5,*pdVar3);
            SetElement(&local_40,iVar6,iVar5,local_78);
            iVar5 = iVar5 + 1;
          } while (iVar5 < local_90.cols);
        }
        iVar6 = iVar8;
        if (iVar8 < local_90.rows) {
          do {
            pdVar3 = operator()(&local_90,iVar6,iVar7);
            local_78 = *pdVar3;
            pdVar3 = operator()(&local_90,iVar7,iVar7);
            if (0 < local_90.cols) {
              local_78 = local_78 / *pdVar3;
              iVar5 = 0;
              do {
                pdVar3 = operator()(&local_90,iVar6,iVar5);
                local_80 = *pdVar3;
                pdVar3 = operator()(&local_90,iVar7,iVar5);
                SetElement(&local_90,iVar6,iVar5,local_80 - *pdVar3 * local_78);
                pdVar3 = operator()(&local_40,iVar6,iVar5);
                local_80 = *pdVar3;
                pdVar3 = operator()(&local_40,iVar7,iVar5);
                SetElement(&local_40,iVar6,iVar5,local_80 - *pdVar3 * local_78);
                iVar5 = iVar5 + 1;
              } while (iVar5 < local_90.cols);
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 < local_90.rows);
        }
      }
      iVar7 = iVar8;
    } while (1e-10 < local_58);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"only square matrix can call this function(inverse)",0x32);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
    *flag = 1;
LAB_00110098:
    if (local_90.data != (double *)0x0) {
      operator_delete__(local_90.data);
    }
  }
  goto LAB_001100a7;
  while( true ) {
    pdVar3 = operator()(&local_90,iVar5,iVar5);
    dVar1 = *pdVar3;
    local_58 = ABS(dVar1);
    uStack_50 = 0;
    if (local_58 <= 1e-15) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"this matrix is not invertible",0x1d);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
      std::ostream::put(-0x10);
      std::ostream::flush();
      *local_60 = 1;
      if (local_90.data != (double *)0x0) {
        operator_delete__(local_90.data);
      }
    }
    else {
      uStack_70 = 0;
      local_78 = dVar1;
      if (0 < local_90.cols) {
        iVar8 = 0;
        do {
          pdVar3 = operator()(&local_90,iVar5,iVar8);
          SetElement(&local_90,iVar5,iVar8,*pdVar3 / local_78);
          pdVar3 = operator()(&local_40,iVar5,iVar8);
          SetElement(&local_40,iVar5,iVar8,*pdVar3 / local_78);
          iVar8 = iVar8 + 1;
        } while (iVar8 < local_90.cols);
      }
      if (iVar7 != 1) {
        iVar7 = 0;
        do {
          pdVar3 = operator()(&local_90,iVar7,iVar5);
          if (0 < local_90.cols) {
            local_78 = *pdVar3;
            iVar8 = 0;
            do {
              pdVar3 = operator()(&local_90,iVar7,iVar8);
              local_80 = *pdVar3;
              pdVar3 = operator()(&local_90,iVar5,iVar8);
              SetElement(&local_90,iVar7,iVar8,local_80 - *pdVar3 * local_78);
              pdVar3 = operator()(&local_40,iVar7,iVar8);
              local_80 = *pdVar3;
              pdVar3 = operator()(&local_40,iVar5,iVar8);
              SetElement(&local_40,iVar7,iVar8,local_80 - *pdVar3 * local_78);
              iVar8 = iVar8 + 1;
            } while (iVar8 < local_90.cols);
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 != iVar6);
      }
    }
    iVar7 = iVar5;
    if (local_58 <= 1e-15) break;
LAB_0010fe9c:
    iVar5 = iVar7 + -1;
    iVar6 = 1;
    if (1 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar7 < 1) {
      *local_60 = 0;
      goto LAB_00110098;
    }
  }
LAB_001100a7:
  MVar2.cols = local_40.cols;
  MVar2.rows = local_40.rows;
  MVar2.data = local_40.data;
  return MVar2;
}

Assistant:

Matrix<Type, _0, _1> Matrix<Type, _0, _1>::inverse(int &flag)
{
    // 此单位阵为待求逆矩阵的增广矩阵
    Matrix<Type, _0, _1> Identity_;
    Matrix<Type, _0, _1> copy;
    copy = (*this);

    if(_0 == Dynamic || _1 == Dynamic)
        Identity_.resize(copy.row(), copy.col());
    Identity_.Identity();

    if(this->col() != this->row())
    {
        cerr << "only square matrix can call this function(inverse)" << endl;
        flag = 1;
        copy.deleteMatrix();
        return Identity_;
    }
    // cout << copy << endl << endl;

    // 将主元置于对角线上
    for (int i = 0; i < copy.row() - 1; ++i)
    {
        // 目前主元位置
        // i行i列
        int posi = i;
        // 初始化主元绝对值大小
        Type value = abs(copy.operator()(i, i));

        // 对第 i+1行开始寻找真正主元
        for(int j = i + 1; j < copy.row(); ++j)
        {
            Type temp = abs(copy.operator()(j, i));
            if(temp > value)
            {
                posi = j;
                value = temp;
            }
        }
        // 若主元为0  则矩阵不可逆
        if (abs(value) <= 1e-10)
        {
            cerr << "this matrix is not invertible" << endl << endl;
            flag = 1;
            copy.deleteMatrix();
            return Identity_;
        }
        // 如果主元不在第i行 则交换两行
        // 同时也要将增广矩阵（单位矩阵）交换相应的两行
        if(posi != i)
        {
            for(int j = 0; j < copy.col(); ++j)
            {
                // 先交换矩阵
                Type temp = copy.operator()(i, j);
                copy.SetElement(i, j, copy.operator()(posi, j));
                copy.SetElement(posi, j, temp);

                // 交换单位阵
                temp = Identity_(i, j);
                Identity_.SetElement(i, j, Identity_(posi, j));
                Identity_.SetElement(posi, j, temp);
            }
        }

        // 将下三角矩阵变为0 (应该可以减少一个循环)
        // 经过实践 并不能少循环
        for(int j = i + 1; j < copy.row(); ++j)
        {
            Type factor = copy.operator()(j, i) / copy.operator()(i, i);
            for(int k = 0; k < copy.col(); ++k)
            {
                Type temp = copy.operator()(j, k) - copy.operator()(i, k) * factor;
                copy.SetElement(j, k, temp);

                temp = Identity_(j, k) - Identity_(i, k) * factor;
                Identity_.SetElement(j, k, temp);
            }
        }
    }

    // 判断对角元素是否为0
    // 若为0则矩阵不可逆
    // 若不为0 则将对角置为1 
    // 且将上三角置为0
    for(int i = copy.row() - 1; i > -1; --i)
    {
        Type temp = copy.operator()(i, i);
        if(abs(temp) <= 1e-15)
        {
            cerr << "this matrix is not invertible" << endl;
            flag = 1;
            copy.deleteMatrix();
            return Identity_;
        }
        // 将对角置1
        for(int j = 0; j < copy.col(); ++j)
        {
            Type deno = copy.operator()(i, j) / temp;
            copy.SetElement(i, j, deno);

            deno = Identity_(i, j) / temp;
            Identity_.SetElement(i, j, deno);
        }
        // 同样的方法上三角置0
        for(int j = 0; j < i; ++j)
        {
            Type deno = copy.operator()(j, i);
            for(int k = 0; k < copy.col(); ++k)
            {
                Type temp = copy.operator()(j, k) - copy.operator()(i, k) * deno;
                copy.SetElement(j, k, temp);
                temp = Identity_(j, k) - Identity_(i, k) * deno;
                Identity_.SetElement(j, k, temp);
            }
        }
    }
    flag = 0;
    copy.deleteMatrix();
    return Identity_;
}